

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool set_config_voice_dir(OpenJTalk *oj,char *path_original)

{
  _Bool _Var1;
  size_t sVar2;
  char *in_RSI;
  long in_RDI;
  char full [260];
  char temp [260];
  char path [260];
  char *in_stack_fffffffffffffca8;
  char *in_stack_fffffffffffffcb0;
  char local_348 [272];
  char local_238 [240];
  char *in_stack_fffffffffffffeb8;
  char local_128 [128];
  char *in_stack_ffffffffffffff58;
  _Bool local_1;
  
  if (g_verbose) {
    console_message((char *)0x1962ff);
  }
  clear_path_string(in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
  strcpy(local_128,in_RSI);
  if (in_RDI == 0) {
    local_1 = false;
  }
  else {
    sVar2 = strlen(local_128);
    if (sVar2 == 0) {
      local_1 = false;
    }
    else {
      clear_path_string(in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
      _Var1 = is_relative(in_stack_fffffffffffffeb8);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_string(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        }
        sVar2 = strlen(g_ini_dir);
        if (sVar2 == 0) {
          return false;
        }
        sVar2 = strlen(g_ini_dir);
        in_stack_fffffffffffffcb0 = (char *)(sVar2 + 1);
        sVar2 = strlen(local_128);
        if ((char *)0x104 < in_stack_fffffffffffffcb0 + sVar2 + 1) {
          return false;
        }
        strcpy(local_238,g_ini_dir);
        strcat(local_238,G_SLASH_CHAR);
        strcat(local_238,local_128);
      }
      else {
        if ((g_verbose & 1U) != 0) {
          console_message_string(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        }
        strcpy(local_238,local_128);
      }
      _Var1 = exists_dir(in_stack_ffffffffffffff58);
      if (_Var1) {
        clear_path_string(in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
        get_fullpath(in_stack_fffffffffffffca8,(char *)0x1964de);
        if ((g_verbose & 1U) != 0) {
          console_message_string(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        }
        strcpy((char *)(in_RDI + 0x10c),local_348);
        local_1 = true;
      }
      else {
        if ((g_verbose & 1U) != 0) {
          console_message_string(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        }
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool set_config_voice_dir(OpenJTalk *oj, const char *path_original)
{
	if (g_verbose)
	{
		console_message(u8"設定ファイルの情報から音響モデルディレクトリを決定\n");
	}

	char path[MAX_PATH];
	clear_path_string(path, MAX_PATH);
#if defined(_WIN32)
	normalize_back_slash(path_original, path);
#else
	strcpy(path, path_original);
#endif

	if (!oj)
	{
		return false;
	}

	if (path != NULL && strlen(path) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	if (is_relative(path))
	{
		if (g_verbose)
		{
			console_message_string(u8"音響モデルディレクトリ指定は相対指定です。： %s\n", path);
		}

		if (g_ini_dir == NULL || strlen(g_ini_dir) == 0)
		{
			return false;
		}

		if (strlen(g_ini_dir) + 1 + strlen(path) + 1 > MAX_PATH)
		{
			return false;
		}

		strcpy(temp, g_ini_dir);
		strcat(temp, G_SLASH_CHAR);
		strcat(temp, path);
	}
	else
	{
		if (g_verbose)
		{
			console_message_string(u8"音響モデルディレクトリ指定は相対指定ではありません。： %s\n", path);
		}
		strcpy(temp, path);
	}

	if (!exists_dir(temp))
	{
		if (g_verbose)
		{
			console_message_string(u8"指定された音響モデルディレクトリは存在しません。： %s\n", temp);
		}
		return false;
	}

	char full[MAX_PATH];
	clear_path_string(full, MAX_PATH);
	get_fullpath(temp, full);
	if (g_verbose)
	{
		console_message_string(u8"指定された音響モデルディレクトリのフルパス： %s\n", full);
	}

	strcpy(oj->dn_voice_dir_path, full);
	return true;
}